

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_tree_init_filename(mpack_tree_t *tree,char *filename,size_t max_bytes)

{
  _Bool _Var1;
  FILE *stdfile;
  FILE *file;
  size_t max_bytes_local;
  char *filename_local;
  mpack_tree_t *tree_local;
  
  _Var1 = mpack_tree_file_check_max_bytes(tree,max_bytes);
  if (_Var1) {
    stdfile = fopen(filename,"rb");
    if (stdfile == (FILE *)0x0) {
      mpack_tree_init_error(tree,mpack_error_io);
    }
    else {
      mpack_tree_init_stdfile(tree,(FILE *)stdfile,max_bytes,true);
    }
  }
  return;
}

Assistant:

void mpack_tree_init_filename(mpack_tree_t* tree, const char* filename, size_t max_bytes) {
    if (!mpack_tree_file_check_max_bytes(tree, max_bytes))
        return;

    // open the file
    FILE* file = fopen(filename, "rb");
    if (!file) {
        mpack_tree_init_error(tree, mpack_error_io);
        return;
    }

    mpack_tree_init_stdfile(tree, file, max_bytes, true);
}